

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O0

double __thiscall Alg::max_cover_lazy(Alg *this,int targetSize,int mode)

{
  size_t sVar1;
  value_type *__n;
  value_type vVar2;
  reference pvVar3;
  pointer pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  iterator __first;
  iterator __last;
  unsigned_long uVar8;
  ostream *poVar9;
  reference puVar10;
  reference puVar11;
  uint uVar12;
  size_type sVar13;
  long lVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  reference rVar20;
  iterator iStack_1b8;
  uint nodeIdx;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  _Bit_type local_198;
  reference local_190;
  size_type local_180;
  unsigned_long edgeIdx;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  double finalInf;
  value_type local_140;
  value_type currDegBound_1;
  value_type currDegBound;
  size_type sStack_128;
  bool flag;
  size_type idxBound;
  undefined1 local_118 [8];
  Nodelist vecBound;
  size_t degBound;
  int topk;
  value_type currDeg;
  size_type sStack_e0;
  value_type argmaxIdx;
  size_type idx;
  value_type *vecNode;
  size_t deg_1;
  undefined1 local_c0 [8];
  vector<bool,_std::allocator<bool>_> edgeMark;
  size_t sumInf;
  uint32_t i_1;
  RRsets degMap;
  size_type deg;
  value_type *pvStack_60;
  uint32_t i;
  size_t maxDeg;
  allocator<unsigned_long> local_41;
  value_type_conflict2 local_40;
  undefined1 local_38 [8];
  FRset coverage;
  int mode_local;
  int targetSize_local;
  Alg *this_local;
  
  this->__boundLast = 1.79769313486232e+308;
  this->__boundMin = 1.79769313486232e+308;
  uVar12 = this->__numV;
  local_40 = 0;
  coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = mode;
  coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = targetSize;
  std::allocator<unsigned_long>::allocator(&local_41);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,(ulong)uVar12,
             &local_40,&local_41);
  std::allocator<unsigned_long>::~allocator(&local_41);
  pvStack_60 = (value_type *)0x0;
  deg._4_4_ = this->__numV;
  while (uVar12 = deg._4_4_ - 1, deg._4_4_ != 0) {
    pvVar3 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](&(this->__hyperG)._FRsets,(ulong)uVar12);
    pvVar4 = (pointer)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar3);
    degMap.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar4;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,
                        (ulong)uVar12);
    *pvVar5 = (value_type)pvVar4;
    deg._4_4_ = uVar12;
    if (pvStack_60 <
        degMap.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pvStack_60 = degMap.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
  }
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             ((long)&sumInf + 7));
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)&i_1,(size_type)
                   ((long)&(pvStack_60->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_start + 1),
           (allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
           ((long)&sumInf + 7));
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             ((long)&sumInf + 7));
  sumInf._0_4_ = this->__numV;
  while (uVar12 = (uint32_t)sumInf - 1, (uint32_t)sumInf != 0) {
    sumInf._0_4_ = uVar12;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,
                        (ulong)uVar12);
    if (*pvVar5 != 0) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,
                          (ulong)(uint32_t)sumInf);
      pvVar6 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)&i_1,*pvVar5);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (pvVar6,(value_type_conflict *)&sumInf);
    }
  }
  edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  sVar13 = this->__numRRsets;
  deg_1._7_1_ = 0;
  sumInf._0_4_ = uVar12;
  std::allocator<bool>::allocator((allocator<bool> *)((long)&deg_1 + 6));
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_c0,sVar13,(bool *)((long)&deg_1 + 7),
             (allocator<bool> *)((long)&deg_1 + 6));
  std::allocator<bool>::~allocator((allocator<bool> *)((long)&deg_1 + 6));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->__vecSeed);
  vecNode = pvStack_60;
  do {
    if (vecNode == (value_type *)0x0) {
      this_local = (Alg *)((double)this->__numV * 1.0);
LAB_00106d92:
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_c0);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)&i_1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
      return (double)this_local;
    }
    idx = (size_type)
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        *)&i_1,(size_type)vecNode);
    sStack_e0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)idx);
    while (sVar13 = sStack_e0 - 1, sStack_e0 != 0) {
      sStack_e0 = sVar13;
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)idx,sVar13);
      currDeg._4_4_ = *pvVar7;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,
                          (ulong)currDeg._4_4_);
      __n = (value_type *)*pvVar5;
      if (__n < vecNode) {
        pvVar6 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)&i_1,(size_type)__n);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (pvVar6,(value_type_conflict *)((long)&currDeg + 4));
      }
      else {
        if ((int)coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage == 2) {
LAB_0010644f:
          degBound._4_4_ =
               coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_;
          vecBound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)vecNode;
          sVar13 = (size_type)
                   coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&idxBound + 7));
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,sVar13,
                     (allocator<unsigned_int> *)((long)&idxBound + 7));
          std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&idxBound + 7))
          ;
          sStack_128 = sStack_e0 + 1;
          while( true ) {
            sVar13 = sStack_128;
            if (degBound._4_4_ != 0) {
              sStack_128 = sStack_128 - 1;
            }
            if (degBound._4_4_ == 0 || sVar13 == 0) break;
            pvVar6 = std::
                     vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   *)&i_1,(size_type)
                                          vecBound.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (pvVar6,sStack_128);
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,
                                (ulong)*pvVar7);
            vVar2 = *pvVar5;
            degBound._4_4_ = degBound._4_4_ + -1;
            pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
                                (long)degBound._4_4_);
            *pvVar7 = (value_type)vVar2;
          }
          while( true ) {
            bVar15 = false;
            if (degBound._4_4_ != 0) {
              vecBound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)((long)vecBound.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage + -1);
              bVar15 = vecBound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0;
            }
            if (!bVar15) break;
            pvVar6 = std::
                     vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   *)&i_1,(size_type)
                                          vecBound.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            sStack_128 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar6);
            while( true ) {
              sVar13 = sStack_128;
              if (degBound._4_4_ != 0) {
                sStack_128 = sStack_128 - 1;
              }
              if (degBound._4_4_ == 0 || sVar13 == 0) break;
              pvVar6 = std::
                       vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                     *)&i_1,(size_type)
                                            vecBound.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
              pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 (pvVar6,sStack_128);
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,
                                  (ulong)*pvVar7);
              vVar2 = *pvVar5;
              degBound._4_4_ = degBound._4_4_ + -1;
              pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,
                                  (long)degBound._4_4_);
              *pvVar7 = (value_type)vVar2;
            }
          }
          make_min_heap((Nodelist *)local_118);
          currDegBound._7_1_ = degBound._4_4_ == 0;
          while( true ) {
            sVar13 = sStack_128;
            bVar15 = (currDegBound._7_1_ & 1) != 0;
            if (bVar15) {
              sStack_128 = sStack_128 - 1;
            }
            if (!bVar15 || sVar13 == 0) break;
            pvVar6 = std::
                     vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   *)&i_1,(size_type)
                                          vecBound.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (pvVar6,sStack_128);
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,
                                (ulong)*pvVar7);
            currDegBound_1 = *pvVar5;
            pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,0);
            if ((pointer)(ulong)*pvVar7 <
                vecBound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,0
                                 );
              if (*pvVar7 < currDegBound_1) {
                min_heap_replace_min_value((Nodelist *)local_118,&currDegBound_1);
              }
            }
            else {
              currDegBound._7_1_ = 0;
            }
          }
          while( true ) {
            bVar15 = false;
            if ((currDegBound._7_1_ & 1) != 0) {
              vecBound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)((long)vecBound.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage + -1);
              bVar15 = vecBound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0;
            }
            if (!bVar15) break;
            pvVar6 = std::
                     vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   *)&i_1,(size_type)
                                          vecBound.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            sStack_128 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar6);
            while( true ) {
              sVar13 = sStack_128;
              bVar15 = (currDegBound._7_1_ & 1) != 0;
              if (bVar15) {
                sStack_128 = sStack_128 - 1;
              }
              if (!bVar15 || sVar13 == 0) break;
              pvVar6 = std::
                       vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                     *)&i_1,(size_type)
                                            vecBound.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
              pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 (pvVar6,sStack_128);
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,
                                  (ulong)*pvVar7);
              local_140 = *pvVar5;
              pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,0
                                 );
              if ((pointer)(ulong)*pvVar7 <
                  vecBound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118
                                    ,0);
                if (*pvVar7 < local_140) {
                  min_heap_replace_min_value((Nodelist *)local_118,&local_140);
                }
              }
              else {
                currDegBound._7_1_ = 0;
              }
            }
          }
          __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118);
          __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118);
          uVar8 = std::
                  accumulate<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_long>
                            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              )__first._M_current,
                             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              )__last._M_current,0);
          lVar14 = uVar8 + (long)edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_end_of_storage;
          auVar16._8_4_ = (int)((ulong)lVar14 >> 0x20);
          auVar16._0_8_ = lVar14;
          auVar16._12_4_ = 0x45300000;
          sVar1 = this->__numRRsets;
          auVar18._8_4_ = (int)(sVar1 >> 0x20);
          auVar18._0_8_ = sVar1;
          auVar18._12_4_ = 0x45300000;
          this->__boundLast =
               (((auVar16._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0)) *
               (double)this->__numV) /
               ((auVar18._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
          if (this->__boundLast <= this->__boundMin && this->__boundMin != this->__boundLast) {
            this->__boundMin = this->__boundLast;
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118);
        }
        else if ((int)coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage == 1) {
          sVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->__vecSeed);
          if (sVar13 == (long)coverage.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)
          goto LAB_0010644f;
        }
        sVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->__vecSeed);
        if ((ulong)(long)coverage.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ <= sVar13) {
          auVar17._8_4_ =
               (int)((ulong)edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage >> 0x20);
          auVar17._0_8_ =
               edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage;
          auVar17._12_4_ = 0x45300000;
          sVar1 = this->__numRRsets;
          auVar19._8_4_ = (int)(sVar1 >> 0x20);
          auVar19._0_8_ = sVar1;
          auVar19._12_4_ = 0x45300000;
          this_local = (Alg *)((((auVar17._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,
                                                  (int)edgeMark.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_end_of_storage) -
                                4503599627370496.0)) * (double)this->__numV) /
                              ((auVar19._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)));
          poVar9 = std::operator<<((ostream *)&std::cout,"  >>>[greedy-lazy] influence: ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,(double)this_local);
          poVar9 = std::operator<<(poVar9,", min-bound: ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->__boundMin);
          poVar9 = std::operator<<(poVar9,", last-bound: ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,this->__boundLast);
          std::operator<<(poVar9,'\n');
          goto LAB_00106d92;
        }
        edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage =
             (_Bit_pointer)
             ((long)edgeMark.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage + (long)__n);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->__vecSeed,(value_type_conflict *)((long)&currDeg + 4));
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,
                            (ulong)currDeg._4_4_);
        *pvVar5 = 0;
        pvVar3 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[](&(this->__hyperG)._FRsets,(ulong)currDeg._4_4_);
        __end3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(pvVar3);
        edgeIdx = (unsigned_long)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(pvVar3);
        while( true ) {
          bVar15 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       *)&edgeIdx);
          if (!bVar15) break;
          puVar10 = __gnu_cxx::
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&__end3);
          local_180 = *puVar10;
          rVar20 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_c0,local_180);
          local_190 = rVar20;
          bVar15 = std::_Bit_reference::operator_cast_to_bool(&local_190);
          if (!bVar15) {
            rVar20 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)local_c0,local_180);
            local_198 = rVar20._M_mask;
            __range4 = (value_type *)rVar20._M_p;
            std::_Bit_reference::operator=((_Bit_reference *)&__range4,true);
            pvVar6 = std::
                     vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ::operator[](&(this->__hyperG)._RRsets,local_180);
            __end4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar6);
            iStack_1b8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar6);
            while( true ) {
              bVar15 = __gnu_cxx::operator!=(&__end4,&stack0xfffffffffffffe48);
              if (!bVar15) break;
              puVar11 = __gnu_cxx::
                        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ::operator*(&__end4);
              uVar12 = *puVar11;
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,
                                  (ulong)uVar12);
              if (*pvVar5 != 0) {
                pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    local_38,(ulong)uVar12);
                *pvVar5 = *pvVar5 - 1;
              }
              __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator++(&__end4);
            }
          }
          __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&__end3);
        }
      }
    }
    sStack_e0 = sVar13;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::pop_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)&i_1);
    vecNode = (value_type *)
              ((long)&vecNode[-1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  } while( true );
}

Assistant:

double Alg::max_cover_lazy(const int targetSize, const int mode)
{
    // mode: optimization mode.
    // 0->no optimization,
    // 1->optimization with the upper bound in the last round,
    // 2->optimization with minimum upper bound among all rounds [Default].
    __boundLast = DBL_MAX, __boundMin = DBL_MAX;
    FRset coverage(__numV, 0);
    size_t maxDeg = 0;
    for (auto i = __numV; i--;)
    {
        const auto deg = __hyperG._FRsets[i].size();
        coverage[i] = deg;
        if (deg > maxDeg) maxDeg = deg;
    }
    RRsets degMap(maxDeg + 1); // degMap: map degree to the nodes with this degree
    for (auto i = __numV; i--;)
    {
        if (coverage[i] == 0) continue;
        degMap[coverage[i]].push_back(i);
    }
    size_t sumInf = 0;

    // check if an edge is removed
    std::vector<bool> edgeMark(__numRRsets, false);

    __vecSeed.clear();
    for (auto deg = maxDeg; deg > 0; deg--) // Enusre deg > 0
    {
        auto& vecNode = degMap[deg];
        for (auto idx = vecNode.size(); idx--;)
        {
            auto argmaxIdx = vecNode[idx];
            const auto currDeg = coverage[argmaxIdx];
            if (deg > currDeg)
            {
                degMap[currDeg].push_back(argmaxIdx);
                continue;
            }
            if (mode == 2 || (mode == 1 && __vecSeed.size() == targetSize))
            {
                // Find upper bound
                auto topk = targetSize;
                auto degBound = deg;
                Nodelist vecBound(targetSize);
                // Initialize vecBound
                auto idxBound = idx + 1;
                while (topk && idxBound--)
                {
                    vecBound[--topk] = coverage[degMap[degBound][idxBound]];
                }
                while (topk && --degBound)
                {
                    idxBound = degMap[degBound].size();
                    while (topk && idxBound--)
                    {
                        vecBound[--topk] = coverage[degMap[degBound][idxBound]];
                    }
                }
                make_min_heap(vecBound);

                // Find the top-k marginal coverage
                auto flag = topk == 0;
                while (flag && idxBound--)
                {
                    const auto currDegBound = coverage[degMap[degBound][idxBound]];
                    if (vecBound[0] >= degBound)
                    {
                        flag = false;
                    }
                    else if (vecBound[0] < currDegBound)
                    {
                        min_heap_replace_min_value(vecBound, currDegBound);
                    }
                }
                while (flag && --degBound)
                {
                    idxBound = degMap[degBound].size();
                    while (flag && idxBound--)
                    {
                        const auto currDegBound = coverage[degMap[degBound][idxBound]];
                        if (vecBound[0] >= degBound)
                        {
                            flag = false;
                        }
                        else if (vecBound[0] < currDegBound)
                        {
                            min_heap_replace_min_value(vecBound, currDegBound);
                        }
                    }
                }
                __boundLast = double(accumulate(vecBound.begin(), vecBound.end(), size_t(0)) + sumInf) *
                        __numV / __numRRsets;
                if (__boundMin > __boundLast) __boundMin = __boundLast;
            }
            if (__vecSeed.size() >= targetSize)
            {
                // Top-k influential nodes constructed
                const auto finalInf = 1.0 * sumInf * __numV / __numRRsets;
                std::cout << "  >>>[greedy-lazy] influence: " << finalInf << ", min-bound: " << __boundMin <<
                          ", last-bound: " << __boundLast << '\n';
                return finalInf;
            }
            sumInf = sumInf + currDeg;
            __vecSeed.push_back(argmaxIdx);
            coverage[argmaxIdx] = 0;
            for (auto edgeIdx : __hyperG._FRsets[argmaxIdx])
            {
                if (edgeMark[edgeIdx]) continue;
                edgeMark[edgeIdx] = true;
                for (auto nodeIdx : __hyperG._RRsets[edgeIdx])
                {
                    if (coverage[nodeIdx] == 0) continue; // This node is seed, skip
                    coverage[nodeIdx]--;
                }
            }
        }
        degMap.pop_back();
    }
    return 1.0 * __numV; // All RR sets are covered.
}